

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O0

bool is_sort(vector<int,_std::allocator<int>_> *arr,int len,Order type)

{
  int iVar1;
  code *pcVar2;
  reference pvVar3;
  int local_28;
  int local_24;
  int i_1;
  int i;
  Order type_local;
  int len_local;
  vector<int,_std::allocator<int>_> *arr_local;
  
  if (type == ABC) {
    for (local_28 = 1; local_28 < len; local_28 = local_28 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](arr,(long)(local_28 + -1));
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](arr,(long)local_28);
      if (*pvVar3 < iVar1) {
        return false;
      }
    }
  }
  else {
    if (type != DESC) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    for (local_24 = 1; local_24 < len; local_24 = local_24 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](arr,(long)(local_24 + -1));
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](arr,(long)local_24);
      if (iVar1 < *pvVar3) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool is_sort(vector<int> arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}